

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool execute(Camera *camera,int x)

{
  Ray *ray;
  bool bVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  ulong *puVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  Vector3f *this;
  Ray camRay;
  Vector3f col;
  Vector3f local_74;
  Vector3f local_68;
  undefined4 local_5c;
  Vector3f local_58;
  Vector3f local_4c;
  undefined4 local_40;
  Vector3f local_3c;
  
  ray = (Ray *)(execute::rt + x);
  if (*(long *)(ray->o).m_elements == 0) {
    puVar4 = (ulong *)operator_new(5000);
    uVar6 = (ulong)(uint)x;
    *puVar4 = uVar6;
    lVar7 = 1;
    do {
      uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar7);
      puVar4[lVar7] = uVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x270);
    puVar4[0x270] = 0x270;
    *(ulong **)(ray->o).m_elements = puVar4;
  }
  lVar7 = (long)camera->height;
  if (0 < lVar7) {
    this = (Vector3f *)(&h + lVar7 * 3 + (long)x * 6000);
    do {
      (*camera->_vptr_Camera[2])
                (&local_58,camera,(ulong)(uint)x,lVar7 + -1,*(undefined8 *)(ray->o).m_elements);
      Vector3f::Vector3f(&local_74,&local_58);
      Vector3f::Vector3f(&local_68,&local_4c);
      local_5c = local_40;
      trace((Runtime *)&local_3c,ray);
      pfVar5 = Vector3f::operator[](&local_3c,0);
      auVar2 = vminss_avx(SUB6416(ZEXT464(0x41200000),0),ZEXT416((uint)*pfVar5));
      auVar2 = vmaxss_avx(ZEXT816(0) << 0x40,auVar2);
      uVar3 = vcmpss_avx512f(auVar2,auVar2,7);
      pfVar5 = Vector3f::operator[](&local_3c,0);
      *pfVar5 = (float)((uint)((byte)uVar3 & 1) * auVar2._0_4_);
      pfVar5 = Vector3f::operator[](&local_3c,1);
      auVar2 = vminss_avx(SUB6416(ZEXT464(0x41200000),0),ZEXT416((uint)*pfVar5));
      auVar2 = vmaxss_avx(ZEXT816(0) << 0x40,auVar2);
      uVar3 = vcmpss_avx512f(auVar2,auVar2,7);
      pfVar5 = Vector3f::operator[](&local_3c,1);
      *pfVar5 = (float)((uint)((byte)uVar3 & 1) * auVar2._0_4_);
      pfVar5 = Vector3f::operator[](&local_3c,2);
      auVar2 = vminss_avx(SUB6416(ZEXT464(0x41200000),0),ZEXT416((uint)*pfVar5));
      auVar2 = vmaxss_avx(ZEXT816(0) << 0x40,auVar2);
      uVar3 = vcmpss_avx512f(auVar2,auVar2,7);
      pfVar5 = Vector3f::operator[](&local_3c,2);
      *pfVar5 = (float)((uint)((byte)uVar3 & 1) * auVar2._0_4_);
      Vector3f::operator+=(this,&local_3c);
      this = this + -1;
      bVar1 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar1);
  }
  return true;
}

Assistant:

bool execute(Camera* camera, int x)
{
	static Runtime rt[2000];
	if (!rt[x].g)
	{
		rt[x].g = new RNG_TYPE(x);
		/*
		rt[x].davg.resize(scene.mat_num);
		rt[x].favg.resize(scene.mat_num);
		for (auto& x : rt[x].davg) x = 1;
		for (auto& x : rt[x].favg) x = 1;
		*/
	}
	for (int y = int(camera->getHeight() - 1); y >= 0; --y)
	{
		Ray camRay = camera->generateRay(x, y, *rt[x].g);
		Vector3f col = trace(rt[x], camRay);
		auto clamp = [&](float t) {if (t > 10) t = 10; if (t < 0) t = 0; if (t != t) t = 0; return t; };
		col[0] = clamp(col[0]);
		col[1] = clamp(col[1]);
		col[2] = clamp(col[2]);
		tot[x][y] += col;
	}
	return 1;
}